

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

TCGv_i32 op_addr_ri_pre(DisasContext_conflict1 *s,arg_ldst_ri *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_i32 pTVar1;
  int local_44;
  TCGv_i32 newsp;
  int ofs;
  TCGContext_conflict1 *tcg_ctx;
  arg_ldst_ri *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  newsp._4_4_ = a->imm;
  if (a->u == 0) {
    newsp._4_4_ = -newsp._4_4_;
  }
  if ((((s->v8m_stackcheck & 1U) != 0) && (a->rn == 0xd)) && (a->w != 0)) {
    if (a->u == 0) {
      pTVar1 = tcg_temp_new_i32(tcg_ctx_00);
      tcg_gen_addi_i32_aarch64(tcg_ctx_00,pTVar1,tcg_ctx_00->cpu_R[0xd],newsp._4_4_);
      gen_helper_v8m_stackcheck(tcg_ctx_00,tcg_ctx_00->cpu_env,pTVar1);
      tcg_temp_free_i32(tcg_ctx_00,pTVar1);
    }
    else {
      gen_helper_v8m_stackcheck(tcg_ctx_00,tcg_ctx_00->cpu_env,tcg_ctx_00->cpu_R[0xd]);
    }
  }
  if (a->p == 0) {
    local_44 = 0;
  }
  else {
    local_44 = newsp._4_4_;
  }
  pTVar1 = add_reg_for_lit(s,a->rn,local_44);
  return pTVar1;
}

Assistant:

static TCGv_i32 op_addr_ri_pre(DisasContext *s, arg_ldst_ri *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int ofs = a->imm;

    if (!a->u) {
        ofs = -ofs;
    }

    if (s->v8m_stackcheck && a->rn == 13 && a->w) {
        /*
         * Stackcheck. Here we know 'addr' is the current SP;
         * U is set if we're moving SP up, else down. It is
         * UNKNOWN whether the limit check triggers when SP starts
         * below the limit and ends up above it; we chose to do so.
         */
        if (!a->u) {
            TCGv_i32 newsp = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_addi_i32(tcg_ctx, newsp, tcg_ctx->cpu_R[13], ofs);
            gen_helper_v8m_stackcheck(tcg_ctx, tcg_ctx->cpu_env, newsp);
            tcg_temp_free_i32(tcg_ctx, newsp);
        } else {
            gen_helper_v8m_stackcheck(tcg_ctx, tcg_ctx->cpu_env, tcg_ctx->cpu_R[13]);
        }
    }

    return add_reg_for_lit(s, a->rn, a->p ? ofs : 0);
}